

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

Noise * __thiscall NoiseSource::createNoise(NoiseSource *this,int n,string *type)

{
  Noise *pNVar1;
  bool bVar2;
  ostream *poVar3;
  WienerNoise *this_00;
  stringstream name;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198;
  
  if (this->aNoises[n] != (Noise *)0x0) {
    return this->aNoises[n];
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar2 = std::operator==(type,"Correlated Wiener Process");
  if (bVar2) {
    poVar3 = std::operator<<(&local_198,"Wiener process");
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
    std::operator<<(poVar3,"]");
    std::ostream::flush();
    this_00 = (WienerNoise *)operator_new(0x180);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"Correlated Wiener Process",&local_209);
    WienerNoise::WienerNoise(this_00,this,n,&local_1e8,&local_208);
  }
  else {
    bVar2 = std::operator==(type,"Correlated Poisson Process");
    if (bVar2) {
      poVar3 = std::operator<<(&local_198,"Poisson process");
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
      std::operator<<(poVar3,"]");
      std::ostream::flush();
      this_00 = (WienerNoise *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Correlated Poisson Process",&local_209);
      PoissonNoise::PoissonNoise((PoissonNoise *)this_00,this,n,&local_1e8,&local_208);
    }
    else {
      bVar2 = std::operator==(type,"Correlated Ornstein-Uhlenbeck Process");
      if (!bVar2) goto LAB_00137df7;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Ornstein-Uhlenbeck process not implemented yet.");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(&local_198,"Wiener process");
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
      std::operator<<(poVar3,"]");
      std::ostream::flush();
      this_00 = (WienerNoise *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Correlated Wiener Process",&local_209);
      WienerNoise::WienerNoise(this_00,this,n,&local_1e8,&local_208);
    }
  }
  this->aNoises[n] = &this_00->super_Noise;
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
LAB_00137df7:
  pNVar1 = this->aNoises[n];
  if (pNVar1 != (Noise *)0x0) {
    std::__cxx11::stringbuf::str();
    (*(pNVar1->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0xc])(pNVar1,local_1c8);
    std::__cxx11::string::~string(local_1c8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this->aNoises[n];
}

Assistant:

Noise *NoiseSource::createNoise( int n, const string &type )
{
	if( !aNoises[n] ) {
		stringstream name;
		if (type=="Correlated Wiener Process") {
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		else if (type=="Correlated Poisson Process") {
			name << "Poisson process" << "[" << n << "]" << flush;
			aNoises[n] = new PoissonNoise(this, n, name.str());
		}
		else if (type=="Correlated Ornstein-Uhlenbeck Process") {
			cout << "Ornstein-Uhlenbeck process not implemented yet." << endl;
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		if( aNoises[n] )
			aNoises[n]->setDescription(name.str());
	}
	 
	return aNoises[n];
}